

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O2

REF_STATUS ref_fixture_twod_cubic_edge(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  undefined8 uVar8;
  int iVar9;
  long lVar10;
  char *pcVar11;
  int iVar12;
  REF_INT RVar13;
  REF_INT cell;
  REF_INT local [27];
  
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 != 0) {
    pcVar11 = "create";
    uVar8 = 0x231;
    goto LAB_00124b94;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  pRVar1->twod = 1;
  iVar5 = ref_mpi->n;
  iVar6 = ref_mpi->id;
  iVar9 = 0;
  iVar4 = (int)(3 / (long)iVar5);
  iVar12 = iVar4 * iVar5;
  if (3 < iVar12) {
    iVar9 = ((((iVar5 + 3) / iVar5) * (iVar12 + -4)) / iVar4 - iVar12) + 4;
  }
  if (iVar6 == iVar9) {
LAB_001246e4:
    uVar3 = ref_node_add(ref_node,0,local);
    if (uVar3 != 0) {
      pcVar11 = "add node";
      uVar8 = 0x244;
      goto LAB_00124b94;
    }
    pRVar2 = ref_node->real;
    lVar10 = (long)local[0];
    pRVar2[lVar10 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar10 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar7 = -1;
    if (((-1 < lVar10) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar10])) {
      lVar7 = ref_node->global[lVar10];
    }
    iVar5 = ref_mpi->n;
    iVar6 = (iVar5 + 3) / iVar5;
    if (lVar7 / (long)iVar6 < (long)(ulong)((int)(3 % (long)iVar5) + 1)) {
      lVar7 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar7 = -1;
        if (-1 < ref_node->global[lVar10]) {
          lVar7 = ref_node->global[lVar10];
        }
      }
      RVar13 = (REF_INT)(lVar7 / (long)iVar6);
    }
    else {
      lVar7 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar7 = -1;
        if (-1 < ref_node->global[lVar10]) {
          lVar7 = ref_node->global[lVar10];
        }
      }
      iVar4 = (int)(3 / (long)iVar5);
      iVar5 = 4 - iVar5 * iVar4;
      RVar13 = iVar5 + (int)((lVar7 - iVar6 * iVar5) / (long)iVar4);
    }
    ref_node->part[lVar10] = RVar13;
    uVar3 = ref_node_add(ref_node,2,local + 1);
    if (uVar3 != 0) {
      pcVar11 = "add node";
      uVar8 = 0x245;
      goto LAB_00124b94;
    }
    pRVar2 = ref_node->real;
    lVar10 = (long)local[1];
    pRVar2[lVar10 * 0xf] = 1.0;
    pRVar2 = pRVar2 + lVar10 * 0xf + 1;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar7 = -1;
    if (((-1 < lVar10) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar10])) {
      lVar7 = ref_node->global[lVar10];
    }
    iVar5 = ref_mpi->n;
    iVar6 = (iVar5 + 3) / iVar5;
    if (lVar7 / (long)iVar6 < (long)(ulong)((int)(3 % (long)iVar5) + 1)) {
      lVar7 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar7 = -1;
        if (-1 < ref_node->global[lVar10]) {
          lVar7 = ref_node->global[lVar10];
        }
      }
      RVar13 = (REF_INT)(lVar7 / (long)iVar6);
    }
    else {
      lVar7 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar7 = -1;
        if (-1 < ref_node->global[lVar10]) {
          lVar7 = ref_node->global[lVar10];
        }
      }
      iVar4 = (int)(3 / (long)iVar5);
      iVar5 = 4 - iVar5 * iVar4;
      RVar13 = iVar5 + (int)((lVar7 - iVar6 * iVar5) / (long)iVar4);
    }
    ref_node->part[lVar10] = RVar13;
    uVar3 = ref_node_add(ref_node,3,local + 2);
    if (uVar3 != 0) {
      pcVar11 = "add node";
      uVar8 = 0x246;
      goto LAB_00124b94;
    }
    pRVar2 = ref_node->real;
    lVar10 = (long)local[2];
    pRVar2[lVar10 * 0xf] = 0.3333333333333333;
    pRVar2 = pRVar2 + lVar10 * 0xf + 1;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar7 = -1;
    if (((-1 < lVar10) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar10])) {
      lVar7 = ref_node->global[lVar10];
    }
    iVar5 = ref_mpi->n;
    iVar6 = (iVar5 + 3) / iVar5;
    if (lVar7 / (long)iVar6 < (long)(ulong)((int)(3 % (long)iVar5) + 1)) {
      lVar7 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar7 = -1;
        if (-1 < ref_node->global[lVar10]) {
          lVar7 = ref_node->global[lVar10];
        }
      }
      RVar13 = (REF_INT)(lVar7 / (long)iVar6);
    }
    else {
      lVar7 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar7 = -1;
        if (-1 < ref_node->global[lVar10]) {
          lVar7 = ref_node->global[lVar10];
        }
      }
      iVar4 = (int)(3 / (long)iVar5);
      iVar5 = 4 - iVar5 * iVar4;
      RVar13 = iVar5 + (int)((lVar7 - iVar6 * iVar5) / (long)iVar4);
    }
    ref_node->part[lVar10] = RVar13;
    uVar3 = ref_node_add(ref_node,1,local + 3);
    if (uVar3 != 0) {
      pcVar11 = "add node";
      uVar8 = 0x247;
      goto LAB_00124b94;
    }
    pRVar2 = ref_node->real;
    lVar10 = (long)local[3];
    pRVar2[lVar10 * 0xf] = 0.6666666666666666;
    pRVar2 = pRVar2 + lVar10 * 0xf + 1;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar7 = -1;
    if (((-1 < lVar10) && (local[3] < ref_node->max)) && (-1 < ref_node->global[lVar10])) {
      lVar7 = ref_node->global[lVar10];
    }
    iVar5 = ref_mpi->n;
    iVar6 = (iVar5 + 3) / iVar5;
    if (lVar7 / (long)iVar6 < (long)(ulong)((int)(3 % (long)iVar5) + 1)) {
      lVar7 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar7 = -1;
        if (-1 < ref_node->global[lVar10]) {
          lVar7 = ref_node->global[lVar10];
        }
      }
      RVar13 = (REF_INT)(lVar7 / (long)iVar6);
    }
    else {
      lVar7 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar7 = -1;
        if (-1 < ref_node->global[lVar10]) {
          lVar7 = ref_node->global[lVar10];
        }
      }
      iVar4 = (int)(3 / (long)iVar5);
      iVar5 = 4 - iVar5 * iVar4;
      RVar13 = iVar5 + (int)((lVar7 - iVar6 * iVar5) / (long)iVar4);
    }
    ref_node->part[lVar10] = RVar13;
    uVar3 = ref_cell_add(pRVar1->cell[2],local,&cell);
    if (uVar3 != 0) {
      pcVar11 = "add tri";
      uVar8 = 0x249;
      goto LAB_00124b94;
    }
  }
  else {
    iVar5 = (iVar5 + 3) / iVar5;
    iVar9 = (int)(2 / (long)iVar5);
    iVar12 = 4 - iVar12;
    if (iVar12 <= iVar9) {
      iVar9 = (2 - iVar5 * iVar12) / iVar4 + iVar12;
    }
    if (iVar6 == iVar9) goto LAB_001246e4;
    iVar9 = (int)(3 / (long)iVar5);
    if (iVar12 <= iVar9) {
      iVar9 = (3 - iVar5 * iVar12) / iVar4 + iVar12;
    }
    if (iVar6 == iVar9) goto LAB_001246e4;
    iVar9 = 0;
    if (iVar5 + 1U < 3) {
      iVar9 = iVar5;
    }
    if (iVar12 <= iVar9) {
      iVar9 = (1 - iVar5 * iVar12) / iVar4 + iVar12;
    }
    if (iVar6 == iVar9) goto LAB_001246e4;
  }
  uVar3 = ref_node_initialize_n_global(ref_node,4);
  if (uVar3 == 0) {
    return 0;
  }
  pcVar11 = "init glob";
  uVar8 = 0x24c;
LAB_00124b94:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar8,
         "ref_fixture_twod_cubic_edge",(ulong)uVar3,pcVar11);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_twod_cubic_edge(REF_GRID *ref_grid_ptr,
                                               REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 4;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  global[0] = 0;
  global[1] = 2;
  global[2] = 3;
  global[3] = 1;
  global[4] = 30;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 1.0 / 3.0, 0.0, 0.0);
    add_that_node(3, 2.0 / 3.0, 0.0, 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  return REF_SUCCESS;
}